

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe.cpp
# Opt level: O3

void fe_mul121666(i32 *h,i32 *f)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  
  iVar9 = f[1];
  iVar10 = f[3];
  iVar11 = f[5];
  iVar12 = f[7];
  iVar13 = f[9];
  lVar1 = (long)iVar13 * 0x1db42 + 0x1000000;
  lVar14 = (lVar1 >> 0x19) * 0x13 + (long)*f * 0x1db42;
  lVar2 = (long)iVar9 * 0x1db42 + 0x1000000;
  lVar15 = (lVar2 >> 0x19) + (long)f[2] * 0x1db42;
  lVar3 = (long)iVar10 * 0x1db42 + 0x1000000;
  lVar17 = (lVar3 >> 0x19) + (long)f[4] * 0x1db42;
  lVar4 = (long)iVar11 * 0x1db42 + 0x1000000;
  lVar18 = (lVar4 >> 0x19) + (long)f[6] * 0x1db42;
  lVar20 = (long)iVar12 * 0x1db42 + 0x1000000;
  lVar16 = (lVar20 >> 0x19) + (long)f[8] * 0x1db42;
  uVar5 = lVar14 + 0x2000000;
  uVar6 = lVar15 + 0x2000000;
  uVar7 = lVar17 + 0x2000000;
  uVar8 = lVar18 + 0x2000000;
  uVar19 = lVar16 + 0x2000000;
  *h = (int)lVar14 - ((uint)uVar5 & 0xfc000000);
  h[1] = (int)(uVar5 >> 0x1a) + ((int)((long)iVar9 * 0x1db42) - ((uint)lVar2 & 0xfe000000));
  h[2] = (int)lVar15 - ((uint)uVar6 & 0xfc000000);
  h[3] = (int)(uVar6 >> 0x1a) + ((int)((long)iVar10 * 0x1db42) - ((uint)lVar3 & 0xfe000000));
  h[4] = (int)lVar17 - ((uint)uVar7 & 0xfc000000);
  h[5] = (int)(uVar7 >> 0x1a) + ((int)((long)iVar11 * 0x1db42) - ((uint)lVar4 & 0xfe000000));
  h[6] = (int)lVar18 - ((uint)uVar8 & 0xfc000000);
  h[7] = (int)(uVar8 >> 0x1a) + ((int)((long)iVar12 * 0x1db42) - ((uint)lVar20 & 0xfe000000));
  h[8] = (int)lVar16 - ((uint)uVar19 & 0xfc000000);
  h[9] = (int)(uVar19 >> 0x1a) + ((int)((long)iVar13 * 0x1db42) - ((uint)lVar1 & 0xfe000000));
  return;
}

Assistant:

void fe_mul121666(fe h, fe f) {
    i32 f0 = f[0];
    i32 f1 = f[1];
    i32 f2 = f[2];
    i32 f3 = f[3];
    i32 f4 = f[4];
    i32 f5 = f[5];
    i32 f6 = f[6];
    i32 f7 = f[7];
    i32 f8 = f[8];
    i32 f9 = f[9];
    i64 h0 = f0 * (i64) 121666;
    i64 h1 = f1 * (i64) 121666;
    i64 h2 = f2 * (i64) 121666;
    i64 h3 = f3 * (i64) 121666;
    i64 h4 = f4 * (i64) 121666;
    i64 h5 = f5 * (i64) 121666;
    i64 h6 = f6 * (i64) 121666;
    i64 h7 = f7 * (i64) 121666;
    i64 h8 = f8 * (i64) 121666;
    i64 h9 = f9 * (i64) 121666;
    i64 carry0;
    i64 carry1;
    i64 carry2;
    i64 carry3;
    i64 carry4;
    i64 carry5;
    i64 carry6;
    i64 carry7;
    i64 carry8;
    i64 carry9;

    carry9 = (h9 + (i64) (1<<24)) >> 25; h0 += carry9 * 19; h9 -= shift_left(carry9, 25);
    carry1 = (h1 + (i64) (1<<24)) >> 25; h2 += carry1; h1 -= shift_left(carry1, 25);
    carry3 = (h3 + (i64) (1<<24)) >> 25; h4 += carry3; h3 -= shift_left(carry3, 25);
    carry5 = (h5 + (i64) (1<<24)) >> 25; h6 += carry5; h5 -= shift_left(carry5, 25);
    carry7 = (h7 + (i64) (1<<24)) >> 25; h8 += carry7; h7 -= shift_left(carry7, 25);

    carry0 = (h0 + (i64) (1<<25)) >> 26; h1 += carry0; h0 -= shift_left(carry0, 26);
    carry2 = (h2 + (i64) (1<<25)) >> 26; h3 += carry2; h2 -= shift_left(carry2, 26);
    carry4 = (h4 + (i64) (1<<25)) >> 26; h5 += carry4; h4 -= shift_left(carry4, 26);
    carry6 = (h6 + (i64) (1<<25)) >> 26; h7 += carry6; h6 -= shift_left(carry6, 26);
    carry8 = (h8 + (i64) (1<<25)) >> 26; h9 += carry8; h8 -= shift_left(carry8, 26);

    h[0] = h0;
    h[1] = h1;
    h[2] = h2;
    h[3] = h3;
    h[4] = h4;
    h[5] = h5;
    h[6] = h6;
    h[7] = h7;
    h[8] = h8;
    h[9] = h9;
}